

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O1

string * __thiscall
iutest::detail::ElementsAreMatcherBase::
WhichIsElem<1,std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>>>
          (string *__return_storage_ptr__,ElementsAreMatcherBase *this,
          tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>_> *matchers,int index
          )

{
  ostream *poVar1;
  iu_global_format_stringstream strm;
  string local_1c8;
  undefined1 local_1a8 [128];
  ios_base local_128 [264];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a8 + 0x10),"ElementsAre(",0xc);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)(local_1a8 + 0x10),(int)matchers);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"): ",3);
  GtMatcher<int>::WhichIs_abi_cxx11_(&local_1c8,(GtMatcher<int> *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

static ::std::string WhichIsElem(const T& matchers, int index)
    {
        iu_global_format_stringstream strm;
        strm << "ElementsAre(" << index << "): " << tuples::get<N>(matchers);
        return strm.str();
    }